

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O0

void __thiscall
jsoncons::jsonschema::
ref_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::do_validate
          (ref_validator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
           *this)

{
  error_reporter *in_stack_00000260;
  evaluation_results *in_stack_00000268;
  json_pointer *in_stack_00000270;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_00000278;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_00000280;
  ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_00000288;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_000002a0;
  
  ref_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
  do_validate(in_stack_00000288,in_stack_00000280,in_stack_00000278,in_stack_00000270,
              in_stack_00000268,in_stack_00000260,in_stack_000002a0);
  return;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& results, 
            error_reporter& reporter, 
            Json& patch) const final
        {
            eval_context<Json> this_context(context, this->keyword_name());

            if (!referred_schema_)
            {
                return reporter.error(validation_message(this->keyword_name(), 
                    this_context.eval_path(),
                    this->schema_location(), 
                    instance_location, 
                    "Unresolved schema reference " + this->schema_location().string()));
            }

            return referred_schema_->validate(this_context, instance, instance_location, results, reporter, patch);
        }